

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::parse(Reader *this,istream *is,Value *root,bool collectComments)

{
  bool bVar1;
  String doc;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  local_38 = 0;
  local_30[0] = '\0';
  local_40 = local_30;
  std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&local_40,-1);
  bVar1 = parse(this,local_40,local_40 + local_38,root,collectComments);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return bVar1;
}

Assistant:

bool Reader::parse(std::istream& is, Value& root, bool collectComments) {
  // std::istream_iterator<char> begin(is);
  // std::istream_iterator<char> end;
  // Those would allow streamed input from a file, if parse() were a
  // template function.

  // Since String is reference-counted, this at least does not
  // create an extra copy.
  String doc;
  std::getline(is, doc, static_cast<char>EOF);
  return parse(doc.data(), doc.data() + doc.size(), root, collectComments);
}